

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_atomax.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* basic functionality */
    TESTCASE( _PDCLIB_atomax( "123" ) == 123 );
    /* testing skipping of leading whitespace and trailing garbage */
    TESTCASE( _PDCLIB_atomax( " \n\v\t\f123xyz" ) == 123 );
#endif
    return TEST_RESULTS;
}